

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

PropResult __thiscall
Clasp::ClauseHead::propagate(ClauseHead *this,Solver *s,Literal p,uint32 *param_3)

{
  uint uVar1;
  pointer puVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ushort uVar6;
  Solver *__ptr;
  ushort uVar7;
  uint uVar8;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *this_00;
  bool bVar9;
  Antecedent local_38;
  
  uVar5 = p.rep_ & 0xfffffffe ^ 2;
  uVar8 = this->head_[1].rep_ ^ uVar5;
  bVar9 = uVar8 < 2;
  uVar1 = this->head_[!bVar9].rep_;
  puVar2 = (s->assign_).assign_.ebo_.buf;
  uVar7 = 0x100;
  uVar6 = 1;
  if ((byte)(*(byte *)((long)puVar2 + (ulong)(uVar1 & 0xfffffffc)) & 3) !=
      (byte)(2U - ((uVar1 & 2) == 0))) {
    uVar1 = this->head_[2].rep_;
    __ptr = (Solver *)
            (CONCAT71((int7)((ulong)puVar2 >> 8),
                      *(undefined1 *)((long)puVar2 + (ulong)(uVar1 & 0xfffffffc))) &
            0xffffffffffffff03);
    if ((char)__ptr == (char)(((uVar1 & 2) == 0) + '\x01')) {
      __ptr = s;
      iVar3 = (*(this->super_Constraint)._vptr_Constraint[0x17])(this,s,(ulong)bVar9);
      if ((char)iVar3 == '\0') {
        local_38.data_ = (uint64)this;
        bVar9 = Solver::force(s,this->head_ + (bVar9 ^ 1),&local_38);
        uVar6 = (ushort)bVar9;
        goto LAB_00169db6;
      }
      this_00 = (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                ((s->watches_).ebo_.buf + ((ulong)(this->head_[uVar8 < 2].rep_ >> 1) ^ 1));
    }
    else {
      this->head_[uVar8 < 2].rep_ = uVar1;
      this->head_[2].rep_ = uVar5;
      this_00 = (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                ((s->watches_).ebo_.buf + ((ulong)(uVar1 >> 1) ^ 1));
    }
    uVar4 = (ulong)this_00->left_;
    if ((ulong)this_00->right_ < uVar4 + 8) {
      bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::realloc
                (this_00,__ptr,uVar4 + 8);
      uVar4 = (ulong)this_00->left_;
    }
    *(ClauseHead **)(this_00->buf_ + uVar4) = this;
    this_00->left_ = (int)uVar4 + 8;
    uVar7 = 0;
  }
LAB_00169db6:
  return (PropResult)(uVar7 | uVar6);
}

Assistant:

Constraint::PropResult ClauseHead::propagate(Solver& s, Literal p, uint32&) {
	Literal* head = head_;
	uint32 wLit   = (head[1] == ~p); // pos of false watched literal
	if (s.isTrue(head[1-wLit])) {
		return Constraint::PropResult(true, true);
	}
	else if (!s.isFalse(head[2])) {
		assert(!isSentinel(head[2]) && "Invalid ClauseHead!");
		head[wLit] = head[2];
		head[2]    = ~p;
		s.addWatch(~head[wLit], ClauseWatch(this));
		return Constraint::PropResult(true, false);
	}
	else if (updateWatch(s, wLit)) {
		assert(!s.isFalse(head_[wLit]));
		s.addWatch(~head[wLit], ClauseWatch(this));
		return Constraint::PropResult(true, false);
	}
	return PropResult(s.force(head_[1^wLit], this), true);
}